

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_bool mz_zip_writer_init_v2(mz_zip_archive *pZip,mz_uint64 existing_size,mz_uint flags)

{
  code *pcVar1;
  mz_zip_internal_state *pmVar2;
  uint uVar3;
  mz_bool mVar4;
  
  mVar4 = 0;
  if (pZip != (mz_zip_archive *)0x0) {
    mVar4 = 0;
    if ((((pZip->m_pState == (mz_zip_internal_state *)0x0) &&
         (pZip->m_pWrite != (mz_file_write_func)0x0)) && (pZip->m_zip_mode == MZ_ZIP_MODE_INVALID))
       && (((-1 < (short)flags || (pZip->m_pRead != (mz_file_read_func)0x0)) &&
           ((pZip->m_file_offset_alignment & pZip->m_file_offset_alignment - 1) == 0)))) {
      pcVar1 = pZip->m_pAlloc;
      if (pcVar1 == (mz_alloc_func)0x0) {
        pcVar1 = miniz_def_alloc_func;
        pZip->m_pAlloc = miniz_def_alloc_func;
      }
      if (pZip->m_pFree == (mz_free_func)0x0) {
        pZip->m_pFree = miniz_def_free_func;
      }
      if (pZip->m_pRealloc == (mz_realloc_func)0x0) {
        pZip->m_pRealloc = miniz_def_realloc_func;
      }
      pZip->m_archive_size = existing_size;
      pZip->m_central_directory_file_ofs = 0;
      pZip->m_total_files = 0;
      pmVar2 = (mz_zip_internal_state *)(*pcVar1)(pZip->m_pAlloc_opaque,1,0x98);
      pZip->m_pState = pmVar2;
      if (pmVar2 == (mz_zip_internal_state *)0x0) {
        pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      }
      else {
        uVar3 = flags >> 0xe & 1;
        memset(pmVar2,0,0x98);
        pmVar2 = pZip->m_pState;
        (pmVar2->m_central_dir).m_element_size = 1;
        (pmVar2->m_central_dir_offsets).m_element_size = 4;
        (pmVar2->m_sorted_central_dir_offsets).m_element_size = 4;
        pmVar2->m_zip64 = uVar3;
        pmVar2->m_zip64_has_extended_info_fields = uVar3;
        pZip->m_zip_mode = MZ_ZIP_MODE_WRITING;
        pZip->m_zip_type = MZ_ZIP_TYPE_USER;
        mVar4 = 1;
      }
    }
    else {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
  }
  return mVar4;
}

Assistant:

mz_bool mz_zip_writer_init_v2(mz_zip_archive *pZip, mz_uint64 existing_size,
                              mz_uint flags) {
  mz_bool zip64 = (flags & MZ_ZIP_FLAG_WRITE_ZIP64) != 0;

  if ((!pZip) || (pZip->m_pState) || (!pZip->m_pWrite) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_INVALID))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  if (flags & MZ_ZIP_FLAG_WRITE_ALLOW_READING) {
    if (!pZip->m_pRead)
      return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
  }

  if (pZip->m_file_offset_alignment) {
    /* Ensure user specified file offset alignment is a power of 2. */
    if (pZip->m_file_offset_alignment & (pZip->m_file_offset_alignment - 1))
      return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);
  }

  if (!pZip->m_pAlloc)
    pZip->m_pAlloc = miniz_def_alloc_func;
  if (!pZip->m_pFree)
    pZip->m_pFree = miniz_def_free_func;
  if (!pZip->m_pRealloc)
    pZip->m_pRealloc = miniz_def_realloc_func;

  pZip->m_archive_size = existing_size;
  pZip->m_central_directory_file_ofs = 0;
  pZip->m_total_files = 0;

  if (NULL == (pZip->m_pState = (mz_zip_internal_state *)pZip->m_pAlloc(
                   pZip->m_pAlloc_opaque, 1, sizeof(mz_zip_internal_state))))
    return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

  memset(pZip->m_pState, 0, sizeof(mz_zip_internal_state));

  MZ_ZIP_ARRAY_SET_ELEMENT_SIZE(&pZip->m_pState->m_central_dir,
                                sizeof(mz_uint8));
  MZ_ZIP_ARRAY_SET_ELEMENT_SIZE(&pZip->m_pState->m_central_dir_offsets,
                                sizeof(mz_uint32));
  MZ_ZIP_ARRAY_SET_ELEMENT_SIZE(&pZip->m_pState->m_sorted_central_dir_offsets,
                                sizeof(mz_uint32));

  pZip->m_pState->m_zip64 = zip64;
  pZip->m_pState->m_zip64_has_extended_info_fields = zip64;

  pZip->m_zip_type = MZ_ZIP_TYPE_USER;
  pZip->m_zip_mode = MZ_ZIP_MODE_WRITING;

  return MZ_TRUE;
}